

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O0

bool __thiscall draco::PointCloudEncoder::GenerateAttributesEncoders(PointCloudEncoder *this)

{
  int32_t iVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  uint *puVar5;
  long *in_RDI;
  uint32_t j;
  uint32_t i_1;
  int i;
  int in_stack_ffffffffffffffac;
  AttributesEncoder *this_00;
  long *__new_size;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  uint local_1c;
  uint local_18;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar6 = local_14;
    iVar1 = PointCloud::num_attributes((PointCloud *)0x1b01f1);
    if (iVar1 <= iVar6) {
      __new_size = in_RDI + 5;
      PointCloud::num_attributes((PointCloud *)0x1b0241);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),
                 (size_type)__new_size);
      for (local_18 = 0;
          sVar4 = std::
                  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                          *)(in_RDI + 2)), local_18 < sVar4; local_18 = local_18 + 1) {
        local_1c = 0;
        while( true ) {
          std::
          vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
          ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                        *)(in_RDI + 2),(ulong)local_18);
          std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
          ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        *)0x1b02aa);
          uVar2 = AttributesEncoder::num_attributes((AttributesEncoder *)0x1b02b2);
          if (uVar2 <= local_1c) break;
          this_00 = (AttributesEncoder *)(in_RDI + 5);
          std::
          vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
          ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                        *)(in_RDI + 2),(ulong)local_18);
          std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
          ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        *)0x1b02ec);
          iVar1 = AttributesEncoder::GetAttributeId(this_00,in_stack_ffffffffffffffac);
          puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)this_00,(long)iVar1);
          *puVar5 = local_18;
          local_1c = local_1c + 1;
        }
      }
      return true;
    }
    uVar3 = (**(code **)(*in_RDI + 0x48))(in_RDI,local_14);
    if ((uVar3 & 1) == 0) break;
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool PointCloudEncoder::GenerateAttributesEncoders() {
  for (int i = 0; i < point_cloud_->num_attributes(); ++i) {
    if (!GenerateAttributesEncoder(i)) {
      return false;
    }
  }
  attribute_to_encoder_map_.resize(point_cloud_->num_attributes());
  for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
    for (uint32_t j = 0; j < attributes_encoders_[i]->num_attributes(); ++j) {
      attribute_to_encoder_map_[attributes_encoders_[i]->GetAttributeId(j)] = i;
    }
  }
  return true;
}